

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int read_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,int skip)

{
  byte bVar1;
  int diff;
  int in_ECX;
  MACROBLOCKD *in_RDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  int segment_id;
  int coded_id;
  aom_cdf_prob *pred_cdf;
  segmentation_probs *segp;
  segmentation *seg;
  FRAME_CONTEXT *ec_ctx;
  uint8_t pred;
  int cdf_num;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  uint local_4;
  
  bVar1 = av1_get_spatial_seg_pred
                    (in_RSI,in_RDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                     in_stack_ffffffffffffffd4);
  if (in_ECX == 0) {
    diff = aom_read_symbol_((aom_reader *)
                            ((in_RSI->quant_params).gqmatrix[5][2][3] +
                            (long)in_stack_ffffffffffffffd8 * 0x12 + 0x30dc),
                            (aom_cdf_prob *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    local_4 = av1_neg_deinterleave(diff,(uint)bVar1,*(int *)(in_RDI + 0x4adc) + 1);
    if (((int)local_4 < 0) || (*(int *)(in_RDI + 0x4adc) < (int)local_4)) {
      aom_internal_error((aom_internal_error_info *)(in_RSI->quant_params).gqmatrix[5][2][0xe],
                         AOM_CODEC_CORRUPT_FRAME,"Corrupted segment_ids");
    }
  }
  else {
    local_4 = (uint)bVar1;
  }
  return local_4;
}

Assistant:

static int read_segment_id(AV1_COMMON *const cm, const MACROBLOCKD *const xd,
                           aom_reader *r, int skip) {
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(cm, xd, &cdf_num, 0);
  if (skip) return pred;

  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  struct segmentation *const seg = &cm->seg;
  struct segmentation_probs *const segp = &ec_ctx->seg;
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  const int coded_id = aom_read_symbol(r, pred_cdf, MAX_SEGMENTS, ACCT_STR);
  const int segment_id =
      av1_neg_deinterleave(coded_id, pred, seg->last_active_segid + 1);

  if (segment_id < 0 || segment_id > seg->last_active_segid) {
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Corrupted segment_ids");
  }
  return segment_id;
}